

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O3

void __thiscall NPC::Act(NPC *this)

{
  byte bVar1;
  byte bVar2;
  World *pWVar3;
  long lVar4;
  _List_node_base *p_Var5;
  pointer ppNVar6;
  NPC *pNVar7;
  Character *pCVar8;
  uint uVar9;
  char cVar10;
  int iVar11;
  WalkResult WVar12;
  NPC_Data *pNVar13;
  ENF_Data *pEVar14;
  mapped_type *pmVar15;
  list<Character_*,_std::allocator<Character_*>_> *plVar16;
  _List_node_base *p_Var17;
  uint uVar18;
  uint uVar19;
  Character *pCVar20;
  uint uVar21;
  Map *this_00;
  int iVar22;
  int iVar23;
  Character *target;
  pointer ppNVar24;
  Direction DVar25;
  double dVar26;
  uint local_74;
  key_type local_70;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pNVar13 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar14 = NPC_Data::ENF(pNVar13);
  if ((pEVar14->child != 0) && (this->parent == (NPC *)0x0)) {
    ppNVar6 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar24 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar24 != ppNVar6; ppNVar24 = ppNVar24 + 1)
    {
      pNVar7 = *ppNVar24;
      pNVar13 = World::GetNpcData(pNVar7->map->world,(short)pNVar7->id);
      pEVar14 = NPC_Data::ENF(pNVar13);
      if (pEVar14->boss != 0) {
        this->parent = pNVar7;
        break;
      }
    }
  }
  iVar11 = util::rand();
  this->last_act = (double)iVar11 / 1000.0 + this->last_act;
  if (this->spawn_type == '\a') {
    return;
  }
  pWVar3 = this->map->world;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NPCChaseDistance","");
  pmVar15 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,&local_70);
  local_74 = util::variant::GetInt(pmVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pNVar13 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar14 = NPC_Data::ENF(pNVar13);
  if (pEVar14->type == Passive) {
LAB_001795aa:
    p_Var17 = (this->damagelist).
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var17 == (_List_node_base *)&this->damagelist) {
      local_50 = 0;
      target = (Character *)0x0;
    }
    else {
      target = (Character *)0x0;
      local_50 = 0;
      do {
        lVar4 = (long)(p_Var17[1]._M_next)->_M_next;
        if ((*(Map **)(lVar4 + 0x470) == this->map) && (*(char *)(lVar4 + 0xd) == '\0')) {
          local_38 = (double)p_Var17[1]._M_next[1]._M_next;
          local_40 = Timer::GetTime();
          pWVar3 = this->map->world;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NPCBoredTimer","");
          pmVar15 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar3->config,&local_70);
          dVar26 = util::variant::GetFloat(pmVar15);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            local_48 = dVar26;
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            dVar26 = local_48;
          }
          if (local_40 - dVar26 <= local_38) {
            p_Var5 = p_Var17[1]._M_next;
            pCVar20 = (Character *)p_Var5->_M_next;
            uVar18 = (uint)pCVar20->x - (uint)this->x;
            uVar19 = -uVar18;
            if (0 < (int)uVar18) {
              uVar19 = uVar18;
            }
            uVar21 = (uint)pCVar20->y - (uint)this->y;
            uVar18 = -uVar21;
            if (0 < (int)uVar21) {
              uVar18 = uVar21;
            }
            uVar19 = (uVar18 & 0xff) + (uVar19 & 0xff) +
                     (uint)((uVar18 & 0xff) + (uVar19 & 0xff) == 0);
            if (uVar19 < (local_74 & 0xff)) {
              uVar18 = *(uint *)&p_Var5->_M_prev;
LAB_001796d5:
              local_50 = (ulong)uVar18;
              target = pCVar20;
              local_74 = uVar19;
            }
            else if (uVar19 == (local_74 & 0xff)) {
              uVar18 = *(uint *)&p_Var5->_M_prev;
              if ((int)(uint)(ushort)local_50 < (int)uVar18) goto LAB_001796d5;
            }
          }
        }
        p_Var17 = p_Var17->_M_next;
      } while (p_Var17 != (_List_node_base *)&this->damagelist);
    }
    pNVar7 = this->parent;
    if (pNVar7 != (NPC *)0x0) {
      p_Var17 = (pNVar7->damagelist).
                super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var17 != (_List_node_base *)&pNVar7->damagelist) {
        do {
          lVar4 = (long)(p_Var17[1]._M_next)->_M_next;
          if ((*(Map **)(lVar4 + 0x470) == this->map) && (*(char *)(lVar4 + 0xd) == '\0')) {
            local_38 = (double)p_Var17[1]._M_next[1]._M_next;
            local_40 = Timer::GetTime();
            pWVar3 = this->map->world;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NPCBoredTimer","");
            pmVar15 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar3->config,&local_70);
            dVar26 = util::variant::GetFloat(pmVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              local_48 = dVar26;
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
              dVar26 = local_48;
            }
            if (local_40 - dVar26 <= local_38) {
              p_Var5 = p_Var17[1]._M_next;
              pCVar20 = (Character *)p_Var5->_M_next;
              uVar18 = (uint)pCVar20->x - (uint)this->x;
              uVar19 = -uVar18;
              if (0 < (int)uVar18) {
                uVar19 = uVar18;
              }
              uVar21 = (uint)pCVar20->y - (uint)this->y;
              uVar18 = -uVar21;
              if (0 < (int)uVar21) {
                uVar18 = uVar21;
              }
              uVar19 = (uVar18 & 0xff) + (uVar19 & 0xff) +
                       (uint)((uVar18 & 0xff) + (uVar19 & 0xff) == 0);
              if (uVar19 < (local_74 & 0xff)) {
                uVar18 = *(uint *)&p_Var5->_M_prev;
LAB_0017987c:
                local_50 = (ulong)uVar18;
                target = pCVar20;
                local_74 = uVar19;
              }
              else if (uVar19 == (local_74 & 0xff)) {
                uVar18 = *(uint *)&p_Var5->_M_prev;
                if ((int)(uint)(ushort)local_50 < (int)uVar18) goto LAB_0017987c;
              }
            }
          }
          p_Var17 = p_Var17->_M_next;
        } while (p_Var17 != (_List_node_base *)&pNVar7->damagelist);
      }
    }
  }
  else {
    pNVar13 = World::GetNpcData(this->map->world,(short)this->id);
    pEVar14 = NPC_Data::ENF(pNVar13);
    if (pEVar14->type == Aggressive) goto LAB_001795aa;
    target = (Character *)0x0;
  }
  pNVar13 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar14 = NPC_Data::ENF(pNVar13);
  if ((pEVar14->type == Aggressive) ||
     ((this->parent != (NPC *)0x0 && (target != (Character *)0x0)))) {
    pWVar3 = this->map->world;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NPCChaseDistance","");
    pmVar15 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,&local_70);
    uVar19 = util::variant::GetInt(pmVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    p_Var17 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    plVar16 = &this->map->characters;
    pCVar20 = target;
    if (p_Var17 != (_List_node_base *)plVar16) {
      uVar18 = local_74 & 0xff;
      if ((byte)uVar19 <= (byte)local_74) {
        uVar18 = uVar19 & 0xff;
      }
      if (target == (Character *)0x0) {
        uVar18 = uVar19 & 0xff;
      }
      do {
        pCVar8 = (Character *)p_Var17[1]._M_next;
        if (((pCVar8->hidden & 4) == 0) && ((pCVar8->nointeract & 4) == 0)) {
          iVar22 = (uint)pCVar8->x - (uint)this->x;
          iVar11 = -iVar22;
          if (0 < iVar22) {
            iVar11 = iVar22;
          }
          iVar23 = (uint)pCVar8->y - (uint)this->y;
          iVar22 = -iVar23;
          if (0 < iVar23) {
            iVar22 = iVar23;
          }
          uVar19 = iVar22 + iVar11 + (uint)(iVar22 + iVar11 == 0);
          uVar18 = uVar18 & 0xff;
          if (uVar19 < uVar18) {
            pCVar20 = pCVar8;
            uVar18 = uVar19;
          }
        }
        p_Var17 = p_Var17->_M_next;
      } while (p_Var17 != (_List_node_base *)plVar16);
    }
    if (pCVar20 != (Character *)0x0) {
      target = pCVar20;
    }
  }
  if (target == (Character *)0x0) {
    if (this->walk_idle_for == 0) {
      iVar11 = util::rand();
      if (iVar11 - 1U < 6) {
        DVar25 = this->direction;
        this_00 = this->map;
        goto LAB_00179b10;
      }
      if (iVar11 - 7U < 3) goto LAB_00179afd;
      if (iVar11 != 10) {
        return;
      }
      iVar11 = util::rand();
    }
    else {
      iVar11 = this->walk_idle_for + -1;
    }
    this->walk_idle_for = iVar11;
  }
  else {
    uVar21 = (uint)this->x - (uint)target->x;
    bVar1 = this->y;
    bVar2 = target->y;
    uVar18 = (uint)bVar1 - (uint)bVar2;
    uVar19 = -uVar21;
    if (0 < (int)uVar21) {
      uVar19 = uVar21;
    }
    uVar9 = -uVar18;
    if (0 < (int)uVar18) {
      uVar9 = uVar18;
    }
    if (((char)uVar19 != '\x01') || (bVar1 != bVar2)) {
      if ((this->x != target->x) || ((uVar9 & 0xff) != 1 && bVar1 != bVar2)) {
        cVar10 = (char)((int)uVar21 >> 0x1f);
        DVar25 = cVar10 * -2 + DIRECTION_LEFT;
        if ((uVar19 & 0xff) <= (uVar9 & 0xff)) {
          DVar25 = (-1 < (int)uVar18) * '\x02';
        }
        this->direction = DVar25;
        WVar12 = Map::Walk(this->map,this,DVar25);
        if (WVar12 != WalkFail) {
          return;
        }
        DVar25 = this->direction;
        if ((DVar25 & ~DIRECTION_UP) == DIRECTION_DOWN) {
          DVar25 = cVar10 * -2 + DIRECTION_LEFT;
          this->direction = DVar25;
        }
        WVar12 = Map::Walk(this->map,this,DVar25);
        if (WVar12 != WalkFail) {
          return;
        }
LAB_00179afd:
        iVar11 = util::rand();
        this_00 = this->map;
        DVar25 = (Direction)iVar11;
LAB_00179b10:
        Map::Walk(this_00,this,DVar25);
        return;
      }
    }
    Attack(this,target);
  }
  return;
}

Assistant:

void NPC::Act()
{
	// Needed for the server startup spawn to work properly
	if (this->ENF().child && !this->parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().boss)
			{
				this->parent = npc;
				break;
			}
		}
	}

	this->last_act += double(util::rand(int(this->act_speed * 750.0), int(this->act_speed * 1250.0))) / 1000.0;

	if (this->spawn_type == 7)
	{
		return;
	}

	Character *attacker = 0;
	unsigned char attacker_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);
	unsigned short attacker_damage = 0;

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
			{
				continue;
			}

			int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
			{
				attacker = opponent->attacker;
				attacker_damage = opponent->damage;
				attacker_distance = distance;
			}
		}

		if (this->parent)
		{
			UTIL_FOREACH_CREF(this->parent->damagelist, opponent)
			{
				if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
				{
					continue;
				}

				int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

				if (distance == 0)
					distance = 1;

				if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
				{
					attacker = opponent->attacker;
					attacker_damage = opponent->damage;
					attacker_distance = distance;
				}
			}
		}
	}

	if (this->ENF().type == ENF::Aggressive || (this->parent && attacker))
	{
		Character *closest = 0;
		unsigned char closest_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);

		if (attacker)
		{
			closest = attacker;
			closest_distance = std::min(closest_distance, attacker_distance);
		}

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->IsHideNpc() || !character->CanInteractCombat())
				continue;

			int distance = util::path_length(character->x, character->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if (distance < closest_distance)
			{
				closest = character;
				closest_distance = distance;
			}
		}

		if (closest)
		{
			attacker = closest;
		}
	}
	
	if (attacker)
	{
		int xdiff = this->x - attacker->x;
		int ydiff = this->y - attacker->y;
		int absxdiff = std::abs(xdiff);
		int absydiff = std::abs(ydiff);

		if ((absxdiff == 1 && absydiff == 0) || (absxdiff == 0 && absydiff == 1) || (absxdiff == 0 && absydiff == 0))
		{
			this->Attack(attacker);
			return;
		}
		else if (absxdiff > absydiff)
		{
			if (xdiff < 0)
			{
				this->direction = DIRECTION_RIGHT;
			}
			else
			{
				this->direction = DIRECTION_LEFT;
			}
		}
		else
		{
			if (ydiff < 0)
			{
				this->direction = DIRECTION_DOWN;
			}
			else
			{
				this->direction = DIRECTION_UP;
			}
		}

		if (this->Walk(this->direction) == Map::WalkFail)
		{
			if (this->direction == DIRECTION_UP || this->direction == DIRECTION_DOWN)
			{
				if (xdiff < 0)
				{
					this->direction = DIRECTION_RIGHT;
				}
				else
				{
					this->direction = DIRECTION_LEFT;
				}
			}

			if (this->Walk(static_cast<Direction>(this->direction)) == Map::WalkFail)
			{
				this->Walk(static_cast<Direction>(util::rand(0,3)));
			}
		}
	}
	else
	{
		// Random walking

		int act;
		if (this->walk_idle_for == 0)
		{
			act = util::rand(1,10);
		}
		else
		{
			--this->walk_idle_for;
			act = 11;
		}

		if (act >= 1 && act <= 6) // 60% chance walk foward
		{
			this->Walk(this->direction);
		}

		if (act >= 7 && act <= 9) // 30% change direction
		{
			this->Walk(static_cast<Direction>(util::rand(0,3)));
		}

		if (act == 10) // 10% take a break
		{
			this->walk_idle_for = util::rand(1,4);
		}
	}
}